

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O0

void __thiscall
slang::analysis::ClockInference::ExpansionInstance::ExpansionInstance
          (ExpansionInstance *this,AssertionInstanceExpression *expr,TimingControl *clock)

{
  bool bVar1;
  size_t in_RDX;
  long in_RSI;
  Expression *in_RDI;
  add_pointer_t<const_slang::ast::Expression_*const> argExpr;
  tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
  *arg;
  iterator __end2;
  iterator __begin2;
  span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
  *__range2;
  __normal_iterator<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffc0;
  span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
  local_28;
  long local_20;
  
  *(long *)in_RDI = in_RSI;
  ((__extent_storage<18446744073709551615UL> *)&in_RDI->type)->_M_extent_value = in_RDX;
  *(undefined1 *)&in_RDI->constant = 0;
  local_20 = in_RSI + 0x40;
  local_28._M_current =
       (tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
        *)std::
          span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
          ::begin((span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
                   *)in_RDI);
  std::
  span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
    ::operator*(&local_28);
    std::
    get<1ul,slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>
              ((tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                *)0x842d6d);
    in_stack_ffffffffffffffc0 =
         (__normal_iterator<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
          *)std::
            get_if<slang::ast::Expression_const*,slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                      ((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        *)0x842d75);
    if ((in_stack_ffffffffffffffc0 !=
         (__normal_iterator<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
          *)0x0) && (bVar1 = isInferredClockCall(in_RDI), bVar1)) break;
    __gnu_cxx::
    __normal_iterator<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*,_std::span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>_>
    ::operator++(&local_28);
  }
  *(undefined1 *)&in_RDI->constant = 1;
  return;
}

Assistant:

ClockInference::ExpansionInstance::ExpansionInstance(const AssertionInstanceExpression& expr,
                                                     const TimingControl* clock) :
    expr(&expr), clock(clock) {

    // Determine if this instance has an inferred clocking default argument.
    for (auto& arg : expr.arguments) {
        if (auto argExpr = std::get_if<const Expression*>(&std::get<1>(arg))) {
            if (ClockInference::isInferredClockCall(**argExpr)) {
                hasInferredClockArg = true;
                break;
            }
        }
    }
}